

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::singletonCol(HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  Result RVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  int in_EDX;
  long *in_RDI;
  HPresolveAnalysis *unaff_retaddr;
  HighsInt in_stack_00000008;
  HighsInt in_stack_0000000c;
  HighsInt in_stack_00000010;
  HighsInt in_stack_00000014;
  undefined7 in_stack_00000018;
  bool logging_on;
  HighsInt in_stack_00000020;
  HighsInt in_stack_00000024;
  HighsInt in_stack_00000028;
  HighsInt in_stack_0000002c;
  Result __result_1;
  Result __result;
  double colCoef;
  HighsInt row;
  HighsInt nzPos;
  bool in_stack_0000007b;
  HighsInt in_stack_0000007c;
  HighsPostsolveStack *in_stack_00000080;
  HPresolve *in_stack_00000088;
  HighsInt in_stack_000000ac;
  HighsPostsolveStack *in_stack_000000b0;
  HPresolve *in_stack_000000b8;
  HighsInt in_stack_00000174;
  HPresolve *in_stack_00000178;
  HighsInt in_stack_ffffffffffffff9c;
  uint7 in_stack_ffffffffffffffa0;
  undefined1 uVar9;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  HPresolve *this_00;
  _Bit_reference in_stack_ffffffffffffffb8;
  HighsInt in_stack_fffffffffffffffc;
  
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)in_EDX);
  iVar1 = *pvVar6;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)iVar1);
  iVar2 = *pvVar6;
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)iVar1);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar2);
  this_00 = (HPresolve *)in_stack_ffffffffffffffb8._M_p;
  if (*pvVar6 == 1) {
    RVar5 = singletonRow(in_stack_000000b8,in_stack_000000b0,in_stack_000000ac);
    if (RVar5 == kOk) {
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xbc),
                          (long)in_EDX);
      if (*pvVar7 == '\0') {
        RVar5 = emptyCol(this_00,(HighsPostsolveStack *)
                                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         (HighsInt)((ulong)in_RDI >> 0x20));
      }
      else {
        RVar5 = kOk;
      }
    }
  }
  else {
    RVar5 = detectDominatedCol(in_stack_00000088,in_stack_00000080,in_stack_0000007c,
                               in_stack_0000007b);
    if (RVar5 == kOk) {
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xbc),
                          (long)in_EDX);
      if (*pvVar7 == '\0') {
        if (in_RDI[3] != 0) {
          convertImpliedInteger
                    ((HPresolve *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000024,
                     in_stack_00000020,logging_on);
        }
        updateColImpliedBounds
                  ((HPresolve *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c,
                   in_stack_00000008,(double)unaff_retaddr);
        pvVar8 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                           ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178)
                            ,(long)in_EDX);
        if (*pvVar8 != kInteger) {
          updateRowDualImpliedBounds
                    (___result_1,in_stack_0000002c,in_stack_00000028,
                     (double)CONCAT44(in_stack_00000024,in_stack_00000020));
        }
        bVar3 = isDualImpliedFree((HPresolve *)
                                  CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                                  (HighsInt)((ulong)in_RDI >> 0x20));
        uVar9 = false;
        if (bVar3) {
          bVar3 = isImpliedFree((HPresolve *)(ulong)in_stack_ffffffffffffffa0,
                                in_stack_ffffffffffffff9c);
          uVar9 = false;
          if (bVar3) {
            std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffb8._M_mask,
                       (size_type)in_stack_ffffffffffffffb8._M_p);
            uVar9 = std::_Bit_reference::operator_cast_to_bool
                              ((_Bit_reference *)&stack0xffffffffffffffb8);
          }
        }
        if ((bool)uVar9 == false) {
          RVar5 = kOk;
        }
        else {
          pvVar8 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                             ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                              (*in_RDI + 0x178),(long)in_EDX);
          if ((*pvVar8 != kInteger) ||
             (bVar3 = isImpliedIntegral(in_stack_00000178,in_stack_00000174), bVar3)) {
            bVar4 = *(byte *)((long)in_RDI + 0x691) & 1;
            if (bVar4 != 0) {
              HPresolveAnalysis::startPresolveRuleLog(unaff_retaddr,in_stack_fffffffffffffffc);
            }
            storeRow((HPresolve *)CONCAT17(uVar9,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
            substituteFreeCol((HPresolve *)CONCAT44(in_stack_00000024,in_stack_00000020),
                              (HighsPostsolveStack *)CONCAT17(logging_on,in_stack_00000018),
                              in_stack_00000014,in_stack_00000010,in_stack_0000000c._3_1_);
            *(byte *)((long)in_RDI + 0x691) = bVar4 & 1;
            if ((bVar4 & 1) != 0) {
              HPresolveAnalysis::stopPresolveRuleLog
                        ((HPresolveAnalysis *)CONCAT44(in_stack_00000014,in_stack_00000010),
                         in_stack_0000000c);
            }
            RVar5 = checkLimits((HPresolve *)CONCAT44(in_stack_0000002c,in_stack_00000028),
                                (HighsPostsolveStack *)CONCAT44(in_stack_00000024,in_stack_00000020)
                               );
          }
          else {
            RVar5 = kOk;
          }
        }
      }
      else {
        RVar5 = kOk;
      }
    }
  }
  return RVar5;
}

Assistant:

HPresolve::Result HPresolve::singletonCol(HighsPostsolveStack& postsolve_stack,
                                          HighsInt col) {
  assert(colsize[col] == 1);
  assert(!colDeleted[col]);
  HighsInt nzPos = colhead[col];
  HighsInt row = Arow[nzPos];
  double colCoef = Avalue[nzPos];

  if (rowsize[row] == 1) {
    HPRESOLVE_CHECKED_CALL(singletonRow(postsolve_stack, row););

    if (!colDeleted[col]) {
      assert(colsize[col] == 0);
      return emptyCol(postsolve_stack, col);
    }
    return Result::kOk;
  }

  // detect strong / weak domination
  HPRESOLVE_CHECKED_CALL(detectDominatedCol(postsolve_stack, col, false));
  if (colDeleted[col]) return Result::kOk;

  if (mipsolver != nullptr) convertImpliedInteger(col, row);

  updateColImpliedBounds(row, col, colCoef);

  if (model->integrality_[col] != HighsVarType::kInteger)
    updateRowDualImpliedBounds(row, col, colCoef);

  // now check if column is implied free within an equation and substitute the
  // column if that is the case
  if (isDualImpliedFree(row) && isImpliedFree(col) &&
      analysis_.allow_rule_[kPresolveRuleFreeColSubstitution]) {
    if (model->integrality_[col] == HighsVarType::kInteger &&
        !isImpliedIntegral(col))
      return Result::kOk;

    const bool logging_on = analysis_.logging_on_;

    if (logging_on)
      analysis_.startPresolveRuleLog(kPresolveRuleFreeColSubstitution);

    // todo, store which side of an implied free dual variable needs to be used
    // for substitution
    storeRow(row);

    substituteFreeCol(postsolve_stack, row, col);

    analysis_.logging_on_ = logging_on;
    if (logging_on)
      analysis_.stopPresolveRuleLog(kPresolveRuleFreeColSubstitution);
    return checkLimits(postsolve_stack);
  }

  // todo: check for zero cost singleton and remove
  return Result::kOk;
}